

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void D_AddWildFile(TArray<FString,_FString> *wadfiles,char *value)

{
  uint uVar1;
  int iVar2;
  char *file;
  void *handle_00;
  void *handle;
  char *sep;
  char path [4096];
  findstate_t findstate;
  char *wadfile;
  char *value_local;
  TArray<FString,_FString> *wadfiles_local;
  
  if ((value != (char *)0x0) && (*value != '\0')) {
    file = BaseFileSearch(value,".wad",false);
    if (file == (char *)0x0) {
      handle_00 = I_FindFirst(value,(findstate_t *)(path + 0xff8));
      strcpy((char *)&sep,value);
      handle = strrchr((char *)&sep,0x2f);
      if ((char *)handle == (char *)0x0) {
        handle = strrchr((char *)&sep,0x5c);
      }
      if (handle_00 != (void *)0xffffffffffffffff) {
        do {
          uVar1 = I_FindAttr((findstate_t *)(path + 0xff8));
          if ((uVar1 & 8) == 0) {
            if (handle == (void *)0x0) {
              D_AddFile(wadfiles,(char *)(*(long *)(findstate._0_8_ +
                                                   (long)(int)findstate.namelist * 8) + 0x13),true,
                        -1);
            }
            else {
              strcpy((char *)((long)handle + 1),
                     (char *)(*(long *)(findstate._0_8_ + (long)(int)findstate.namelist * 8) + 0x13)
                    );
              D_AddFile(wadfiles,(char *)&sep,true,-1);
            }
          }
          iVar2 = I_FindNext(handle_00,(findstate_t *)(path + 0xff8));
        } while (iVar2 == 0);
      }
      I_FindClose(handle_00);
    }
    else {
      D_AddFile(wadfiles,file,true,-1);
    }
  }
  return;
}

Assistant:

void D_AddWildFile (TArray<FString> &wadfiles, const char *value)
{
	if (value == NULL || *value == '\0')
	{
		return;
	}
	const char *wadfile = BaseFileSearch (value, ".wad");

	if (wadfile != NULL)
	{
		D_AddFile (wadfiles, wadfile);
	}
	else
	{ // Try pattern matching
		findstate_t findstate;
		char path[PATH_MAX];
		char *sep;
		void *handle = I_FindFirst (value, &findstate);

		strcpy (path, value);
		sep = strrchr (path, '/');
		if (sep == NULL)
		{
			sep = strrchr (path, '\\');
#ifdef _WIN32
			if (sep == NULL && path[1] == ':')
			{
				sep = path + 1;
			}
#endif
		}

		if (handle != ((void *)-1))
		{
			do
			{
				if (!(I_FindAttr(&findstate) & FA_DIREC))
				{
					if (sep == NULL)
					{
						D_AddFile (wadfiles, I_FindName (&findstate));
					}
					else
					{
						strcpy (sep+1, I_FindName (&findstate));
						D_AddFile (wadfiles, path);
					}
				}
			} while (I_FindNext (handle, &findstate) == 0);
		}
		I_FindClose (handle);
	}
}